

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::AddDebugValueForVariable
          (DebugInfoManager *this,Instruction *scope_and_line,uint32_t variable_id,uint32_t value_id
          ,Instruction *insert_pos)

{
  ulong uVar1;
  Instruction *pIVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  bool bVar8;
  
  if (scope_and_line == (Instruction *)0x0) {
    __assert_fail("scope_and_line != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x235,
                  "bool spvtools::opt::analysis::DebugInfoManager::AddDebugValueForVariable(Instruction *, uint32_t, uint32_t, Instruction *)"
                 );
  }
  uVar1 = (this->var_id_to_dbg_decl_)._M_h._M_bucket_count;
  uVar4 = (ulong)variable_id % uVar1;
  p_Var6 = (this->var_id_to_dbg_decl_)._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     *(uint32_t *)&p_Var6->_M_nxt[1]._M_nxt != variable_id)) {
    while (p_Var6 = p_Var5, p_Var5 = p_Var6->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var5[1]._M_nxt == variable_id)) goto LAB_0059c67b;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0059c67b:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var7->_M_nxt;
  }
  if (p_Var5 != (_Hash_node_base *)0x0) {
    p_Var3 = (_Rb_tree_node_base *)p_Var5[5]._M_nxt;
    if (p_Var3 != (_Rb_tree_node_base *)(p_Var5 + 3)) {
      bVar8 = false;
      do {
        pIVar2 = insert_pos;
        do {
          pIVar2 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
            pIVar2 = (Instruction *)0x0;
          }
        } while ((pIVar2->opcode_ == OpVariable) || (pIVar2->opcode_ == OpPhi));
        pIVar2 = AddDebugValueForDecl
                           (this,*(Instruction **)(p_Var3 + 1),value_id,pIVar2,scope_and_line);
        bVar8 = (bool)(bVar8 | pIVar2 != (Instruction *)0x0);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != (_Rb_tree_node_base *)(p_Var5 + 3));
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool DebugInfoManager::AddDebugValueForVariable(Instruction* scope_and_line,
                                                uint32_t variable_id,
                                                uint32_t value_id,
                                                Instruction* insert_pos) {
  assert(scope_and_line != nullptr);

  auto dbg_decl_itr = var_id_to_dbg_decl_.find(variable_id);
  if (dbg_decl_itr == var_id_to_dbg_decl_.end()) return false;

  bool modified = false;
  for (auto* dbg_decl_or_val : dbg_decl_itr->second) {
    // Avoid inserting the new DebugValue between OpPhi or OpVariable
    // instructions.
    Instruction* insert_before = insert_pos->NextNode();
    while (insert_before->opcode() == spv::Op::OpPhi ||
           insert_before->opcode() == spv::Op::OpVariable) {
      insert_before = insert_before->NextNode();
    }
    modified |= AddDebugValueForDecl(dbg_decl_or_val, value_id, insert_before,
                                     scope_and_line) != nullptr;
  }
  return modified;
}